

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr10r1100sixx.cpp
# Opt level: O0

CheckValue<double> IKatan2WithCheck<double>(double fy,double fx,double epsilon)

{
  uint uVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  double dVar3;
  CheckValue<double> CVar4;
  double epsilon_local;
  double fx_local;
  double fy_local;
  CheckValue<double> ret;
  undefined8 uVar2;
  
  ret.value._0_1_ = 0;
  fy_local = 0.0;
  uVar1 = std::isnan(fy);
  uVar2 = CONCAT44(extraout_var,uVar1);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isnan(fx);
    uVar2 = CONCAT44(extraout_var_00,uVar1);
    if (((uVar1 & 1) == 0) &&
       ((dVar3 = IKabs(fy), 1e-07 <= dVar3 ||
        (dVar3 = IKabs(fx), uVar2 = extraout_RAX, 1e-07 < dVar3)))) {
      fy_local = IKatan2Simple(fy,fx);
      ret.value._0_1_ = 1;
      uVar2 = extraout_RAX_00;
    }
  }
  CVar4._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  CVar4.valid = (bool)ret.value._0_1_;
  CVar4.value = fy_local;
  return CVar4;
}

Assistant:

inline CheckValue<T> IKatan2WithCheck(T fy, T fx, T epsilon)
{
    CheckValue<T> ret;
    ret.valid = false;
    ret.value = 0;
    if( !isnan(fy) && !isnan(fx) ) {
        if( IKabs(fy) >= IKFAST_ATAN2_MAGTHRESH || IKabs(fx) > IKFAST_ATAN2_MAGTHRESH ) {
            ret.value = IKatan2Simple(fy,fx);
            ret.valid = true;
        }
    }
    return ret;
}